

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmSourceFile * __thiscall cmMakefile::GetSource(cmMakefile *this,string *sourceName)

{
  bool bVar1;
  reference ppcVar2;
  cmSourceFile *sf;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_78;
  const_iterator sfi;
  cmSourceFileLocation sfl;
  string *sourceName_local;
  cmMakefile *this_local;
  
  cmSourceFileLocation::cmSourceFileLocation((cmSourceFileLocation *)&sfi,this,sourceName);
  local_78._M_current =
       (cmSourceFile **)
       std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin(&this->SourceFiles);
  while( true ) {
    sf = (cmSourceFile *)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end(&this->SourceFiles);
    bVar1 = __gnu_cxx::operator!=
                      (&local_78,
                       (__normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                        *)&sf);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
              ::operator*(&local_78);
    this_local = (cmMakefile *)*ppcVar2;
    bVar1 = cmSourceFile::Matches((cmSourceFile *)this_local,(cmSourceFileLocation *)&sfi);
    if (bVar1) goto LAB_004fd010;
    __gnu_cxx::
    __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&local_78);
  }
  this_local = (cmMakefile *)0x0;
LAB_004fd010:
  cmSourceFileLocation::~cmSourceFileLocation((cmSourceFileLocation *)&sfi);
  return (cmSourceFile *)this_local;
}

Assistant:

cmSourceFile* cmMakefile::GetSource(const std::string& sourceName) const
{
  cmSourceFileLocation sfl(this, sourceName);
  for (std::vector<cmSourceFile*>::const_iterator sfi =
         this->SourceFiles.begin();
       sfi != this->SourceFiles.end(); ++sfi) {
    cmSourceFile* sf = *sfi;
    if (sf->Matches(sfl)) {
      return sf;
    }
  }
  return CM_NULLPTR;
}